

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_generic_trigo.hpp
# Opt level: O2

batch<float,_xsimd::avx512bw> * __thiscall
xsimd::kernel::acos<xsimd::avx512bw,float>
          (batch<float,_xsimd::avx512bw> *__return_storage_ptr__,kernel *this,
          batch<float,_xsimd::avx512bw> *self,requires_arch<generic> param_2)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  undefined1 auVar4 [64];
  batch<float,_xsimd::avx512bw> *pbVar5;
  ushort uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  simd_register<float,_xsimd::avx512dq> sVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  batch<float,_xsimd::avx512bw> local_c0 [2];
  
  auVar10 = *(undefined1 (*) [64])
             (__return_storage_ptr__->super_simd_register<float,_xsimd::avx512bw>).
             super_simd_register<float,_xsimd::avx512dq>.super_simd_register<float,_xsimd::avx512cd>
             .super_simd_register<float,_xsimd::avx512f>.data;
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar7._16_4_ = 0x7fffffff;
  auVar7._20_4_ = 0x7fffffff;
  auVar7._24_4_ = 0x7fffffff;
  auVar7._28_4_ = 0x7fffffff;
  auVar7._32_4_ = 0x7fffffff;
  auVar7._36_4_ = 0x7fffffff;
  auVar7._40_4_ = 0x7fffffff;
  auVar7._44_4_ = 0x7fffffff;
  auVar7._48_4_ = 0x7fffffff;
  auVar7._52_4_ = 0x7fffffff;
  auVar7._56_4_ = 0x7fffffff;
  auVar7._60_4_ = 0x7fffffff;
  auVar7 = vandpd_avx512dq(auVar10,auVar7);
  auVar8 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
  uVar3 = vcmpps_avx512f(auVar8,auVar7,1);
  uVar6 = (ushort)uVar3;
  auVar4._8_4_ = 0xbf000000;
  auVar4._0_8_ = 0xbf000000bf000000;
  auVar4._12_4_ = 0xbf000000;
  auVar4._16_4_ = 0xbf000000;
  auVar4._20_4_ = 0xbf000000;
  auVar4._24_4_ = 0xbf000000;
  auVar4._28_4_ = 0xbf000000;
  auVar4._32_4_ = 0xbf000000;
  auVar4._36_4_ = 0xbf000000;
  auVar4._40_4_ = 0xbf000000;
  auVar4._44_4_ = 0xbf000000;
  auVar4._48_4_ = 0xbf000000;
  auVar4._52_4_ = 0xbf000000;
  auVar4._56_4_ = 0xbf000000;
  auVar4._60_4_ = 0xbf000000;
  auVar7 = vfmadd132ps_avx512f(auVar7,auVar8,auVar4);
  auVar7 = vsqrtps_avx512f(auVar7);
  bVar1 = (bool)((byte)uVar3 & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [0] = (uint)bVar1 * auVar7._0_4_ | (uint)!bVar1 * auVar10._0_4_;
  bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [1] = (uint)bVar1 * auVar7._4_4_ | (uint)!bVar1 * auVar10._4_4_;
  bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [2] = (uint)bVar1 * auVar7._8_4_ | (uint)!bVar1 * auVar10._8_4_;
  bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [3] = (uint)bVar1 * auVar7._12_4_ | (uint)!bVar1 * auVar10._12_4_;
  bVar1 = (bool)((byte)(uVar3 >> 4) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [4] = (uint)bVar1 * auVar7._16_4_ | (uint)!bVar1 * auVar10._16_4_;
  bVar1 = (bool)((byte)(uVar3 >> 5) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [5] = (uint)bVar1 * auVar7._20_4_ | (uint)!bVar1 * auVar10._20_4_;
  bVar1 = (bool)((byte)(uVar3 >> 6) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [6] = (uint)bVar1 * auVar7._24_4_ | (uint)!bVar1 * auVar10._24_4_;
  bVar1 = (bool)((byte)(uVar3 >> 7) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [7] = (uint)bVar1 * auVar7._28_4_ | (uint)!bVar1 * auVar10._28_4_;
  bVar2 = (byte)(uVar3 >> 8);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [8] = (uint)(bVar2 & 1) * auVar7._32_4_ | (uint)!(bool)(bVar2 & 1) * auVar10._32_4_;
  bVar1 = (bool)((byte)(uVar3 >> 9) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [9] = (uint)bVar1 * auVar7._36_4_ | (uint)!bVar1 * auVar10._36_4_;
  bVar1 = (bool)((byte)(uVar3 >> 10) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [10] = (uint)bVar1 * auVar7._40_4_ | (uint)!bVar1 * auVar10._40_4_;
  bVar1 = (bool)((byte)(uVar3 >> 0xb) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [0xb] = (uint)bVar1 * auVar7._44_4_ | (uint)!bVar1 * auVar10._44_4_;
  bVar1 = (bool)((byte)(uVar3 >> 0xc) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [0xc] = (uint)bVar1 * auVar7._48_4_ | (uint)!bVar1 * auVar10._48_4_;
  bVar1 = (bool)((byte)(uVar3 >> 0xd) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [0xd] = (uint)bVar1 * auVar7._52_4_ | (uint)!bVar1 * auVar10._52_4_;
  bVar1 = (bool)((byte)(uVar3 >> 0xe) & 1);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [0xe] = (uint)bVar1 * auVar7._56_4_ | (uint)!bVar1 * auVar10._56_4_;
  bVar1 = SUB81(uVar3 >> 0xf,0);
  sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data
  [0xf] = (float)((uint)bVar1 * auVar7._60_4_ | (uint)!bVar1 * auVar10._60_4_);
  local_c0[0].super_simd_register<float,_xsimd::avx512bw>.
  super_simd_register<float,_xsimd::avx512dq>.super_simd_register<float,_xsimd::avx512cd>.
  super_simd_register<float,_xsimd::avx512f>.data =
       (simd_register<float,_xsimd::avx512bw>)
       (simd_register<float,_xsimd::avx512bw>)
       sVar9.super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.
       data;
  pbVar5 = asin<float,xsimd::avx512bw>(local_c0,(xsimd *)this,self);
  auVar10 = vaddps_avx512f((undefined1  [64])
                           sVar9.super_simd_register<float,_xsimd::avx512cd>.
                           super_simd_register<float,_xsimd::avx512f>.data,
                           (undefined1  [64])
                           sVar9.super_simd_register<float,_xsimd::avx512cd>.
                           super_simd_register<float,_xsimd::avx512f>.data);
  bVar1 = (bool)((byte)uVar3 & 1);
  auVar8._0_4_ = (uint)bVar1 * auVar10._0_4_ |
                 (uint)!bVar1 *
                 (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
                      super_simd_register<float,_xsimd::avx512f>.data[0];
  bVar1 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar8._4_4_ = (uint)bVar1 * auVar10._4_4_ |
                 (uint)!bVar1 *
                 (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
                      super_simd_register<float,_xsimd::avx512f>.data[1];
  bVar1 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar8._8_4_ = (uint)bVar1 * auVar10._8_4_ |
                 (uint)!bVar1 *
                 (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
                      super_simd_register<float,_xsimd::avx512f>.data[2];
  bVar1 = (bool)((byte)(uVar6 >> 3) & 1);
  auVar8._12_4_ =
       (uint)bVar1 * auVar10._12_4_ |
       (uint)!bVar1 *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[3];
  bVar1 = (bool)((byte)(uVar6 >> 4) & 1);
  auVar8._16_4_ =
       (uint)bVar1 * auVar10._16_4_ |
       (uint)!bVar1 *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[4];
  bVar1 = (bool)((byte)(uVar6 >> 5) & 1);
  auVar8._20_4_ =
       (uint)bVar1 * auVar10._20_4_ |
       (uint)!bVar1 *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[5];
  bVar1 = (bool)((byte)(uVar6 >> 6) & 1);
  auVar8._24_4_ =
       (uint)bVar1 * auVar10._24_4_ |
       (uint)!bVar1 *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[6];
  bVar1 = (bool)((byte)(uVar6 >> 7) & 1);
  auVar8._28_4_ =
       (uint)bVar1 * auVar10._28_4_ |
       (uint)!bVar1 *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[7];
  auVar8._32_4_ =
       (uint)(bVar2 & 1) * auVar10._32_4_ |
       (uint)!(bool)(bVar2 & 1) *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[8];
  bVar1 = (bool)(bVar2 >> 1 & 1);
  auVar8._36_4_ =
       (uint)bVar1 * auVar10._36_4_ |
       (uint)!bVar1 *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[9];
  bVar1 = (bool)(bVar2 >> 2 & 1);
  auVar8._40_4_ =
       (uint)bVar1 * auVar10._40_4_ |
       (uint)!bVar1 *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[10];
  bVar1 = (bool)(bVar2 >> 3 & 1);
  auVar8._44_4_ =
       (uint)bVar1 * auVar10._44_4_ |
       (uint)!bVar1 *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[0xb];
  bVar1 = (bool)(bVar2 >> 4 & 1);
  auVar8._48_4_ =
       (uint)bVar1 * auVar10._48_4_ |
       (uint)!bVar1 *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[0xc];
  bVar1 = (bool)(bVar2 >> 5 & 1);
  auVar8._52_4_ =
       (uint)bVar1 * auVar10._52_4_ |
       (uint)!bVar1 *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[0xd];
  bVar1 = (bool)(bVar2 >> 6 & 1);
  auVar8._56_4_ =
       (uint)bVar1 * auVar10._56_4_ |
       (uint)!bVar1 *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[0xe];
  auVar8._60_4_ =
       (uint)(bVar2 >> 7) * auVar10._60_4_ |
       (uint)!(bool)(bVar2 >> 7) *
       (int)sVar9.super_simd_register<float,_xsimd::avx512cd>.
            super_simd_register<float,_xsimd::avx512f>.data[0xf];
  auVar10 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
  uVar3 = vcmpps_avx512f(auVar10,*(undefined1 (*) [64])
                                  (__return_storage_ptr__->
                                  super_simd_register<float,_xsimd::avx512bw>).
                                  super_simd_register<float,_xsimd::avx512dq>.
                                  super_simd_register<float,_xsimd::avx512cd>.
                                  super_simd_register<float,_xsimd::avx512f>.data,0xe);
  auVar10 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
  auVar7 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
  auVar10 = vsubps_avx512f(auVar10,auVar8);
  bVar1 = (bool)((byte)uVar3 & 1);
  auVar11._0_4_ = (uint)bVar1 * auVar10._0_4_ | !bVar1 * auVar8._0_4_;
  bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
  auVar11._4_4_ = (uint)bVar1 * auVar10._4_4_ | !bVar1 * auVar8._4_4_;
  bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
  auVar11._8_4_ = (uint)bVar1 * auVar10._8_4_ | !bVar1 * auVar8._8_4_;
  bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
  auVar11._12_4_ = (uint)bVar1 * auVar10._12_4_ | !bVar1 * auVar8._12_4_;
  bVar1 = (bool)((byte)(uVar3 >> 4) & 1);
  auVar11._16_4_ = (uint)bVar1 * auVar10._16_4_ | !bVar1 * auVar8._16_4_;
  bVar1 = (bool)((byte)(uVar3 >> 5) & 1);
  auVar11._20_4_ = (uint)bVar1 * auVar10._20_4_ | !bVar1 * auVar8._20_4_;
  bVar1 = (bool)((byte)(uVar3 >> 6) & 1);
  auVar11._24_4_ = (uint)bVar1 * auVar10._24_4_ | !bVar1 * auVar8._24_4_;
  bVar1 = (bool)((byte)(uVar3 >> 7) & 1);
  auVar11._28_4_ = (uint)bVar1 * auVar10._28_4_ | !bVar1 * auVar8._28_4_;
  bVar1 = (bool)((byte)(uVar3 >> 8) & 1);
  auVar11._32_4_ = (uint)bVar1 * auVar10._32_4_ | !bVar1 * auVar8._32_4_;
  bVar1 = (bool)((byte)(uVar3 >> 9) & 1);
  auVar11._36_4_ = (uint)bVar1 * auVar10._36_4_ | !bVar1 * auVar8._36_4_;
  bVar1 = (bool)((byte)(uVar3 >> 10) & 1);
  auVar11._40_4_ = (uint)bVar1 * auVar10._40_4_ | !bVar1 * auVar8._40_4_;
  bVar1 = (bool)((byte)(uVar3 >> 0xb) & 1);
  auVar11._44_4_ = (uint)bVar1 * auVar10._44_4_ | !bVar1 * auVar8._44_4_;
  bVar1 = (bool)((byte)(uVar3 >> 0xc) & 1);
  auVar11._48_4_ = (uint)bVar1 * auVar10._48_4_ | !bVar1 * auVar8._48_4_;
  bVar1 = (bool)((byte)(uVar3 >> 0xd) & 1);
  auVar11._52_4_ = (uint)bVar1 * auVar10._52_4_ | !bVar1 * auVar8._52_4_;
  bVar1 = (bool)((byte)(uVar3 >> 0xe) & 1);
  auVar11._56_4_ = (uint)bVar1 * auVar10._56_4_ | !bVar1 * auVar8._56_4_;
  bVar1 = SUB81(uVar3 >> 0xf,0);
  auVar11._60_4_ = (uint)bVar1 * auVar10._60_4_ | !bVar1 * auVar8._60_4_;
  vsubps_avx512f(auVar7,auVar11);
  return pbVar5;
}

Assistant:

inline batch<T, A> acos(batch<T, A> const& self, requires_arch<generic>) noexcept
        {
            using batch_type = batch<T, A>;
            batch_type x = abs(self);
            auto x_larger_05 = x > batch_type(0.5);
            x = select(x_larger_05, sqrt(fma(batch_type(-0.5), x, batch_type(0.5))), self);
            x = asin(x);
            x = select(x_larger_05, x + x, x);
            x = select(self < batch_type(-0.5), constants::pi<batch_type>() - x, x);
            return select(x_larger_05, x, constants::pio2<batch_type>() - x);
        }